

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int patternCompare(u8 *zPattern,u8 *zString,int esc,int noCase)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  u8 *z;
  int iVar6;
  bool bVar7;
  u8 *zString_local;
  u8 *zPattern_local;
  uint local_40;
  int local_3c;
  u8 *local_38;
  
  if (zString == (u8 *)0x0 || zPattern == (u8 *)0x0) {
    return 0;
  }
  zString_local = zString;
  zPattern_local = zPattern;
  local_40 = esc;
  local_3c = noCase;
  bVar1 = false;
  do {
    while( true ) {
      while( true ) {
        uVar2 = jx9Utf8Read(zPattern_local,(uchar *)0x0,&zPattern_local);
        if (uVar2 == 0) {
          return (uint)(*zString_local == '\0');
        }
        if (uVar2 == 0x2a && !bVar1) {
          while( true ) {
            do {
              uVar2 = jx9Utf8Read(zPattern_local,(uchar *)0x0,&zPattern_local);
            } while (uVar2 == 0x2a);
            if (uVar2 != 0x3f) break;
            iVar3 = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
            if (iVar3 == 0) {
              return 0;
            }
          }
          if (uVar2 != 0) {
            if (uVar2 == local_40) {
              uVar2 = jx9Utf8Read(zPattern_local,(uchar *)0x0,&zPattern_local);
              if (uVar2 == 0) {
                return 0;
              }
            }
            else if (uVar2 == 0x5b) {
              return 0;
            }
            iVar3 = local_3c;
            local_38 = zPattern_local;
            z = zString_local;
            do {
              uVar5 = jx9Utf8Read(z,(uchar *)0x0,&zString_local);
              if (uVar5 == 0) {
                return 0;
              }
              if (iVar3 == 0) {
                while ((uVar5 != 0 && (uVar5 != uVar2))) {
                  uVar5 = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
                }
              }
              else {
                if ((int)uVar5 < 0x80) {
                  uVar5 = (uint)""[(int)uVar5];
                }
                if ((int)uVar2 < 0x80) {
                  uVar2 = (uint)""[(int)uVar2];
                }
                while ((uVar5 != 0 && (uVar5 != uVar2))) {
                  uVar5 = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
                  if ((int)uVar5 < 0x80) {
                    uVar5 = (uint)""[(int)uVar5];
                  }
                }
              }
              z = zString_local;
              if (uVar5 == 0) {
                return 0;
              }
              iVar4 = patternCompare(local_38,zString_local,local_40,iVar3);
            } while (iVar4 == 0);
          }
          return 1;
        }
        if (uVar2 != 0x3f || bVar1) break;
        bVar1 = false;
        iVar3 = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
        if (iVar3 == 0) {
          return 0;
        }
      }
      if (uVar2 == 0x5b) break;
      bVar7 = bVar1 || uVar2 != local_40;
      bVar1 = true;
      if (bVar7) {
        uVar5 = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
        if (local_3c != 0) {
          if ((int)uVar2 < 0x80) {
            uVar2 = (uint)""[(int)uVar2];
          }
          if ((int)uVar5 < 0x80) {
            uVar5 = (uint)""[(int)uVar5];
          }
        }
        bVar1 = false;
        if (uVar2 != uVar5) {
          return 0;
        }
      }
    }
    if (local_40 == 0) {
      return 0;
    }
    iVar3 = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
    if (iVar3 == 0) {
      return 0;
    }
    uVar2 = 0;
    iVar4 = jx9Utf8Read(zPattern_local,(uchar *)0x0,&zPattern_local);
    bVar7 = iVar4 == 0x5e;
    if (bVar7) {
      iVar4 = jx9Utf8Read(zPattern_local,(uchar *)0x0,&zPattern_local);
    }
    local_38 = (u8 *)CONCAT44(local_38._4_4_,(uint)bVar7);
    iVar6 = 0;
    if (iVar4 != 0x5d) goto LAB_0013702a;
    iVar6 = 0;
    uVar5 = (uint)(iVar3 == 0x5d);
    while( true ) {
      while( true ) {
        uVar2 = uVar5;
        iVar4 = jx9Utf8Read(zPattern_local,(uchar *)0x0,&zPattern_local);
LAB_0013702a:
        if (iVar4 != 0x2d) break;
        if ((*zPattern_local == ']') || (iVar6 < 1 || *zPattern_local == '\0')) goto LAB_00137093;
        iVar4 = jx9Utf8Read(zPattern_local,(uchar *)0x0,&zPattern_local);
        uVar5 = 1;
        if (iVar4 < iVar3) {
          uVar5 = uVar2;
        }
        bVar7 = iVar3 < iVar6;
        iVar6 = 0;
        if (bVar7) {
          uVar5 = uVar2;
        }
      }
      if (iVar4 == 0x5d) break;
      if (iVar4 == 0) {
        return 0;
      }
LAB_00137093:
      iVar6 = iVar4;
      uVar5 = uVar2;
      if (iVar3 == iVar4) {
        uVar5 = 1;
      }
    }
    if (uVar2 == (uint)local_38) {
      return 0;
    }
  } while( true );
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const int esc,                    /* The escape character */
  int noCase
){
  int c, c2;
  int invert;
  int seen;
  u8 matchOne = '?';
  u8 matchAll = '*';
  u8 matchSet = '[';
  int prevEscape = 0;     /* True if the previous character was 'escape' */

  if( !zPattern || !zString ) return 0;
  while( (c = jx9Utf8Read(zPattern, 0, &zPattern))!=0 ){
    if( !prevEscape && c==matchAll ){
      while( (c= jx9Utf8Read(zPattern, 0, &zPattern)) == matchAll
               || c == matchOne ){
        if( c==matchOne && jx9Utf8Read(zString, 0, &zString)==0 ){
          return 0;
        }
      }
      if( c==0 ){
        return 1;
      }else if( c==esc ){
        c = jx9Utf8Read(zPattern, 0, &zPattern);
        if( c==0 ){
          return 0;
        }
      }else if( c==matchSet ){
	  if( (esc==0) || (matchSet<0x80) ) return 0;
	  while( *zString && patternCompare(&zPattern[-1], zString, esc, noCase)==0 ){
          SQLITE_SKIP_UTF8(zString);
        }
        return *zString!=0;
      }
      while( (c2 = jx9Utf8Read(zString, 0, &zString))!=0 ){
        if( noCase ){
          GlogUpperToLower(c2);
          GlogUpperToLower(c);
          while( c2 != 0 && c2 != c ){
            c2 = jx9Utf8Read(zString, 0, &zString);
            GlogUpperToLower(c2);
          }
        }else{
          while( c2 != 0 && c2 != c ){
            c2 = jx9Utf8Read(zString, 0, &zString);
          }
        }
        if( c2==0 ) return 0;
		if( patternCompare(zPattern, zString, esc, noCase) ) return 1;
      }
      return 0;
    }else if( !prevEscape && c==matchOne ){
      if( jx9Utf8Read(zString, 0, &zString)==0 ){
        return 0;
      }
    }else if( c==matchSet ){
      int prior_c = 0;
      if( esc == 0 ) return 0;
      seen = 0;
      invert = 0;
      c = jx9Utf8Read(zString, 0, &zString);
      if( c==0 ) return 0;
      c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      if( c2=='^' ){
        invert = 1;
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      if( c2==']' ){
        if( c==']' ) seen = 1;
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      while( c2 && c2!=']' ){
        if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
          c2 = jx9Utf8Read(zPattern, 0, &zPattern);
          if( c>=prior_c && c<=c2 ) seen = 1;
          prior_c = 0;
        }else{
          if( c==c2 ){
            seen = 1;
          }
          prior_c = c2;
        }
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      if( c2==0 || (seen ^ invert)==0 ){
        return 0;
      }
    }else if( esc==c && !prevEscape ){
      prevEscape = 1;
    }else{
      c2 = jx9Utf8Read(zString, 0, &zString);
      if( noCase ){
        GlogUpperToLower(c);
        GlogUpperToLower(c2);
      }
      if( c!=c2 ){
        return 0;
      }
      prevEscape = 0;
    }
  }
  return *zString==0;
}